

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PCMTrack.cpp
# Opt level: O3

void __thiscall
Storage::Disk::PCMTrack::PCMTrack
          (PCMTrack *this,
          vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_> *segments)

{
  pointer pPVar1;
  Time TVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ulong __m;
  unsigned_long uVar6;
  _Ct __n2_1;
  ulong uVar7;
  PCMSegment *segment;
  pointer pPVar8;
  _Ct __n2_2;
  ulong uVar9;
  _Ct __m2;
  _Ct __n2;
  PCMSegment local_98;
  ulong local_40;
  Time local_38;
  
  (this->super_Track)._vptr_Track = (_func_int **)&PTR__PCMTrack_005a2df0;
  (this->segment_event_sources_).
  super__Vector_base<Storage::Disk::PCMSegmentEventSource,_std::allocator<Storage::Disk::PCMSegmentEventSource>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->segment_event_sources_).
  super__Vector_base<Storage::Disk::PCMSegmentEventSource,_std::allocator<Storage::Disk::PCMSegmentEventSource>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->segment_event_sources_).
  super__Vector_base<Storage::Disk::PCMSegmentEventSource,_std::allocator<Storage::Disk::PCMSegmentEventSource>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->segment_pointer_ = 0;
  this->is_resampled_clone_ = false;
  pPVar8 = (segments->
           super__Vector_base<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pPVar1 = (segments->
           super__Vector_base<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pPVar8 == pPVar1) {
    uVar4 = 1;
    __m = 0;
LAB_004438b5:
    uVar3 = std::__detail::__gcd<unsigned_int>((uint)__m,uVar4);
    pPVar8 = (segments->
             super__Vector_base<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pPVar1 = (segments->
             super__Vector_base<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (pPVar8 != pPVar1) {
      local_40 = (ulong)uVar4 / (ulong)uVar3;
      do {
        Time::Time(&local_98.length_of_a_bit,
                   (ulong)((*(int *)&(pPVar8->data).super__Bvector_base<std::allocator<bool>_>.
                                     _M_impl.super__Bvector_impl_data._M_finish.
                                     super__Bit_iterator_base._M_p -
                           *(int *)&(pPVar8->data).super__Bvector_base<std::allocator<bool>_>.
                                    _M_impl.super__Bvector_impl_data._M_start.
                                    super__Bit_iterator_base._M_p) * 8 +
                          (pPVar8->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset) *
                   (ulong)(pPVar8->length_of_a_bit).length,
                   (ulong)(pPVar8->length_of_a_bit).clock_rate);
        Time::Time(&local_98.length_of_a_bit,
                   ((ulong)local_98.length_of_a_bit & 0xffffffff) * local_40,
                   ((ulong)local_98.length_of_a_bit >> 0x20) * ((__m & 0xffffffff) / (ulong)uVar3));
        TVar2 = local_98.length_of_a_bit;
        uVar9 = (ulong)local_98.length_of_a_bit >> 0x20;
        uVar4 = std::__detail::__gcd<unsigned_int>
                          (local_98.length_of_a_bit.length,local_98.length_of_a_bit.clock_rate);
        local_98.length_of_a_bit = pPVar8->length_of_a_bit;
        std::vector<bool,_std::allocator<bool>_>::vector(&local_98.data,&pPVar8->data);
        std::vector<bool,_std::allocator<bool>_>::vector(&local_98.fuzzy_mask,&pPVar8->fuzzy_mask);
        Time::Time(&local_38,((ulong)TVar2 & 0xffffffff) / (ulong)uVar4,
                   (ulong)((*(int *)&(pPVar8->data).super__Bvector_base<std::allocator<bool>_>.
                                     _M_impl.super__Bvector_impl_data._M_finish.
                                     super__Bit_iterator_base._M_p -
                           *(int *)&(pPVar8->data).super__Bvector_base<std::allocator<bool>_>.
                                    _M_impl.super__Bvector_impl_data._M_start.
                                    super__Bit_iterator_base._M_p) * 8 +
                          (pPVar8->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset) *
                   (uVar9 / uVar4));
        local_98.length_of_a_bit = local_38;
        uVar4 = std::__detail::__gcd<unsigned_int>(local_38.length,local_38.clock_rate);
        local_98.length_of_a_bit.clock_rate = local_98.length_of_a_bit.clock_rate / uVar4;
        local_98.length_of_a_bit.length = local_98.length_of_a_bit.length / uVar4;
        std::
        vector<Storage::Disk::PCMSegmentEventSource,std::allocator<Storage::Disk::PCMSegmentEventSource>>
        ::emplace_back<Storage::Disk::PCMSegment&>
                  ((vector<Storage::Disk::PCMSegmentEventSource,std::allocator<Storage::Disk::PCMSegmentEventSource>>
                    *)&this->segment_event_sources_,&local_98);
        if (local_98.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
          operator_delete(local_98.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                          (long)local_98.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>.
                                _M_impl.super__Bvector_impl_data._M_end_of_storage -
                          (long)local_98.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>.
                                _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                _M_p);
          local_98.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
          local_98.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
          local_98.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
          local_98.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
          local_98.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
        }
        if (local_98.data.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
          operator_delete(local_98.data.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                          (long)local_98.data.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_end_of_storage -
                          (long)local_98.data.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
        }
        pPVar8 = pPVar8 + 1;
      } while (pPVar8 != pPVar1);
    }
    return;
  }
  __m = 0;
  uVar9 = 1;
LAB_0044376d:
  Time::Time(&local_98.length_of_a_bit,
             (ulong)((*(int *)&(pPVar8->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                     *(int *)&(pPVar8->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 +
                    (pPVar8->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset) *
             (ulong)(pPVar8->length_of_a_bit).length,(ulong)(pPVar8->length_of_a_bit).clock_rate);
  uVar5 = (ulong)local_98.length_of_a_bit & 0xffffffff;
  if (uVar5 != 0) {
    uVar7 = (ulong)local_98.length_of_a_bit >> 0x20;
    if ((int)__m == 0) {
      __m = (ulong)local_98.length_of_a_bit & 0xffffffff;
      uVar9 = uVar7;
    }
    else {
      if ((uint)uVar9 == local_98.length_of_a_bit.clock_rate) {
        __m = uVar5 + (__m & 0xffffffff);
        uVar7 = uVar9;
      }
      else {
        __m = uVar5 * uVar9 + (__m & 0xffffffff) * uVar7;
        uVar7 = uVar9 * uVar7;
      }
      if ((uVar7 | __m) >> 0x20 != 0) {
        uVar9 = 1;
        if (__m == 0) {
          __m = 0;
          goto LAB_0044389b;
        }
        uVar5 = __m;
        if (((uVar7 | __m) & 0xf) == 0) {
          do {
            __m = uVar5 >> 4;
            uVar4 = (uint)uVar5;
            uVar3 = (uint)uVar7;
            uVar7 = uVar7 >> 4;
            uVar5 = __m;
          } while (((uVar4 | uVar3) & 0xf0) == 0);
        }
        uVar4 = ((uint)__m | (uint)uVar7) & 1;
        while (uVar4 == 0) {
          uVar4 = (uint)uVar7;
          uVar7 = uVar7 >> 1;
          uVar4 = ((uint)__m | uVar4) & 2;
          __m = __m >> 1;
        }
        if ((__m >> 0x20 != 0) || (uVar7 >> 0x20 != 0)) {
          uVar6 = std::__detail::__gcd<unsigned_long>(__m,uVar7);
          __m = __m / uVar6;
          uVar7 = uVar7 / uVar6;
          do {
            if (__m >> 0x20 == 0) {
              if (uVar7 >> 0x20 == 0) break;
            }
            else if (uVar7 < 2) goto LAB_00443890;
            __m = __m >> 1;
            uVar7 = uVar7 >> 1;
          } while( true );
        }
      }
      uVar9 = uVar7 & 0xffffffff;
    }
  }
  goto LAB_0044389b;
LAB_00443890:
  __m = 0xffffffff;
LAB_0044389b:
  pPVar8 = pPVar8 + 1;
  uVar4 = (uint)uVar9;
  if (pPVar8 == pPVar1) goto LAB_004438b5;
  goto LAB_0044376d;
}

Assistant:

PCMTrack::PCMTrack(const std::vector<PCMSegment> &segments) : PCMTrack() {
	// sum total length of all segments
	Time total_length;
	for(const auto &segment : segments) {
		total_length += segment.length_of_a_bit * unsigned(segment.data.size());
	}
	total_length.simplify();

	// each segment is then some proportion of the total; for them all to sum to 1 they'll
	// need to be adjusted to be
	for(const auto &segment : segments) {
		Time original_length_of_segment = segment.length_of_a_bit * unsigned(segment.data.size());
		Time proportion_of_whole = original_length_of_segment / total_length;
		proportion_of_whole.simplify();
		PCMSegment length_adjusted_segment = segment;
		length_adjusted_segment.length_of_a_bit = proportion_of_whole / unsigned(segment.data.size());
		length_adjusted_segment.length_of_a_bit.simplify();
		segment_event_sources_.emplace_back(length_adjusted_segment);
	}
}